

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O1

int uv_try_write(uv_stream_t *stream,uv_buf_t *bufs,uint nbufs)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  uv_write_t req;
  uv_write_t local_f0;
  
  iVar2 = -0xb;
  if ((stream->connect_req == (uv_connect_t *)0x0) && (stream->write_queue_size == 0)) {
    iVar1 = uv__io_active(&stream->io_watcher,4);
    iVar2 = uv_write2(&local_f0,stream,bufs,nbufs,(uv_stream_t *)0x0,uv_try_write_cb);
    if (iVar2 == 0) {
      sVar3 = uv__count_bufs(bufs,nbufs);
      if (local_f0.bufs == (uv_buf_t *)0x0) {
        sVar4 = 0;
      }
      else {
        sVar4 = uv__write_req_size(&local_f0);
      }
      stream->write_queue_size = stream->write_queue_size - sVar4;
      *(void **)local_f0.queue[1] = local_f0.queue[0];
      *(void **)((long)local_f0.queue[0] + 8) = local_f0.queue[1];
      if (stream->loop->active_reqs == (void **)stream->loop->active_reqs[0]) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x5f5,"int uv_try_write(uv_stream_t *, const uv_buf_t *, unsigned int)");
      }
      *(void **)local_f0.active_queue[1] = local_f0.active_queue[0];
      *(void **)((long)local_f0.active_queue[0] + 8) = local_f0.active_queue[1];
      if (local_f0.bufs != local_f0.bufsml) {
        uv__free(local_f0.bufs);
      }
      iVar5 = (int)sVar3 - (int)sVar4;
      local_f0.bufs = (uv_buf_t *)0x0;
      if (iVar1 == 0) {
        uv__io_stop(stream->loop,&stream->io_watcher,4);
      }
      iVar2 = -0xb;
      if (sVar4 == 0) {
        iVar2 = iVar5;
      }
      if (sVar3 != sVar4) {
        iVar2 = iVar5;
      }
    }
  }
  return iVar2;
}

Assistant:

int uv_try_write(uv_stream_t* stream,
                 const uv_buf_t bufs[],
                 unsigned int nbufs) {
  int r;
  int has_pollout;
  size_t written;
  size_t req_size;
  uv_write_t req;

  /* Connecting or already writing some data */
  if (stream->connect_req != NULL || stream->write_queue_size != 0)
    return -EAGAIN;

  has_pollout = uv__io_active(&stream->io_watcher, POLLOUT);

  r = uv_write(&req, stream, bufs, nbufs, uv_try_write_cb);
  if (r != 0)
    return r;

  /* Remove not written bytes from write queue size */
  written = uv__count_bufs(bufs, nbufs);
  if (req.bufs != NULL)
    req_size = uv__write_req_size(&req);
  else
    req_size = 0;
  written -= req_size;
  stream->write_queue_size -= req_size;

  /* Unqueue request, regardless of immediateness */
  QUEUE_REMOVE(&req.queue);
  uv__req_unregister(stream->loop, &req);
  if (req.bufs != req.bufsml)
    uv__free(req.bufs);
  req.bufs = NULL;

  /* Do not poll for writable, if we wasn't before calling this */
  if (!has_pollout) {
    uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  if (written == 0 && req_size != 0)
    return -EAGAIN;
  else
    return written;
}